

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

GLFWbool waitForEvent(double *timeout)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  int *piVar4;
  uint64_t uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int error;
  int result;
  uint64_t base;
  timeval tv;
  long microseconds;
  long seconds;
  fd_set_conflict *__arr;
  int local_a0;
  uint __i;
  int count;
  int fd;
  fd_set_conflict fds;
  double *timeout_local;
  
  fds.__fds_bits[0xf] = (__fd_mask)timeout;
  iVar2 = *(int *)(_glfw.x11.display + 0x10);
  local_a0 = iVar2 + 1;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    (&count + (ulong)__arr._4_4_ * 2)[0] = 0;
    (&count + (ulong)__arr._4_4_ * 2)[1] = 0;
  }
  *(ulong *)(&count + (long)(iVar2 / 0x40) * 2) =
       1L << ((byte)((long)iVar2 % 0x40) & 0x3f) | *(ulong *)(&count + (long)(iVar2 / 0x40) * 2);
  *(ulong *)(&count + (long)(_glfw.linux_js.inotify / 0x40) * 2) =
       1L << ((byte)((long)_glfw.linux_js.inotify % 0x40) & 0x3f) |
       *(ulong *)(&count + (long)(_glfw.linux_js.inotify / 0x40) * 2);
  if (iVar2 < _glfw.linux_js.inotify) {
    local_a0 = _glfw.linux_js.inotify + 1;
  }
  do {
    while (fds.__fds_bits[0xf] == 0) {
      iVar2 = select(local_a0,(fd_set *)&count,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      if ((iVar2 != -1) || (piVar4 = __errno_location(), *piVar4 != 4)) {
        return 1;
      }
    }
    base = (uint64_t)*(double *)fds.__fds_bits[0xf];
    tv.tv_sec = (__time_t)((*(double *)fds.__fds_bits[0xf] - (double)(long)base) * 1000000.0);
    tv.tv_usec = tv.tv_sec;
    uVar3 = _glfwPlatformGetTimerValue();
    iVar1 = select(local_a0,(fd_set *)&count,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&base);
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    uVar5 = _glfwPlatformGetTimerValue();
    lVar6 = uVar5 - uVar3;
    auVar7._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar7._0_8_ = lVar6;
    auVar7._12_4_ = 0x45300000;
    uVar3 = _glfwPlatformGetTimerFrequency();
    auVar8._8_4_ = (int)(uVar3 >> 0x20);
    auVar8._0_8_ = uVar3;
    auVar8._12_4_ = 0x45300000;
    *(double *)fds.__fds_bits[0xf] =
         *(double *)fds.__fds_bits[0xf] -
         ((auVar7._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
         ((auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
    if (0 < iVar1) {
      return 1;
    }
  } while (((iVar1 != -1) || (iVar2 != 4)) && (0.0 < *(double *)fds.__fds_bits[0xf]));
  return 0;
}

Assistant:

static GLFWbool waitForEvent(double* timeout)
{
    fd_set fds;
    const int fd = ConnectionNumber(_glfw.x11.display);
    int count = fd + 1;

    FD_ZERO(&fds);
    FD_SET(fd, &fds);
#if defined(__linux__)
    FD_SET(_glfw.linux_js.inotify, &fds);

    if (fd < _glfw.linux_js.inotify)
        count = _glfw.linux_js.inotify + 1;
#endif
    for (;;)
    {
        if (timeout)
        {
            const long seconds = (long) *timeout;
            const long microseconds = (long) ((*timeout - seconds) * 1e6);
            struct timeval tv = { seconds, microseconds };
            const uint64_t base = _glfwPlatformGetTimerValue();

            const int result = select(count, &fds, NULL, NULL, &tv);
            const int error = errno;

            *timeout -= (_glfwPlatformGetTimerValue() - base) /
                (double) _glfwPlatformGetTimerFrequency();

            if (result > 0)
                return GLFW_TRUE;
            if ((result == -1 && error == EINTR) || *timeout <= 0.0)
                return GLFW_FALSE;
        }
        else if (select(count, &fds, NULL, NULL, NULL) != -1 || errno != EINTR)
            return GLFW_TRUE;
    }
}